

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O0

void __thiscall Am_Connection::Send(Am_Connection *this,Am_Value *value)

{
  unsigned_short uVar1;
  uint32_t uVar2;
  byte local_81;
  unsigned_short local_6a;
  Am_Marshall_Method local_68;
  Am_Value local_48;
  ulong local_38;
  unsigned_long net_type;
  unsigned_long type;
  Am_Marshall_Method Marshaller;
  Am_Value *value_local;
  Am_Connection *this_local;
  
  Marshaller.Call = (Am_Marshall_Method_Type *)value;
  while( true ) {
    local_81 = 0;
    if (this->data != (Am_Connection_Data *)0x0) {
      local_81 = this->data->connected ^ 0xff;
    }
    if ((local_81 & 1) == 0) break;
    Wait_For_Connect();
  }
  Am_Marshall_Method::Am_Marshall_Method((Am_Marshall_Method *)&type);
  Am_Value::Am_Value(&local_48,(uint)value->type);
  uVar1 = OpenAmulet::Map<Am_Value,_unsigned_short,_std::less<Am_Value>_>::GetAt(&Types,&local_48);
  net_type = (unsigned_long)uVar1;
  Am_Value::~Am_Value(&local_48);
  if (net_type == 0) {
    Am_Error("Send:Tried to send unknown type!");
  }
  uVar2 = htonl((uint32_t)net_type);
  local_38 = (ulong)uVar2;
  send(*(int *)&(this->data->super_Am_Wrapper).field_0xc,&local_38,8,0);
  local_6a = (unsigned_short)net_type;
  local_68 = OpenAmulet::Map<unsigned_short,_Am_Marshall_Method,_std::less<unsigned_short>_>::GetAt
                       (&Marshall_Methods,&local_6a);
  type = (unsigned_long)local_68.from_wrapper;
  Marshaller.from_wrapper = (Am_Method_Wrapper *)local_68.Call;
  (*local_68.Call)(*(undefined4 *)&(this->data->super_Am_Wrapper).field_0xc,value);
  return;
}

Assistant:

void
Am_Connection::Send(Am_Value value)
{
  while ((data != nullptr) && (!(data->connected))) {
    Am_Connection::Wait_For_Connect();
  }
  Am_Marshall_Method Marshaller;
  unsigned long type, net_type;

  type = Am_Connection::Types.GetAt(value.type);
  if (type == Am_NONE)
    Am_Error("Send:Tried to send unknown type!");
  else {
    net_type = htonl(type);
    send(data->m_socket, &net_type, sizeof(net_type), 0);
    Marshaller = (Am_Connection::Marshall_Methods.GetAt(type));
    Marshaller.Call(data->m_socket, value, this);
  }
}